

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_alloter.cpp
# Opt level: O0

shared_ptr<cppnet::NormalAlloter> cppnet::MakeNormalAlloterPtr(void)

{
  element_type *in_RDI;
  shared_ptr<cppnet::NormalAlloter> sVar1;
  
  sVar1 = std::make_shared<cppnet::NormalAlloter>();
  sVar1.super___shared_ptr<cppnet::NormalAlloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppnet::NormalAlloter>)
         sVar1.super___shared_ptr<cppnet::NormalAlloter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<NormalAlloter> MakeNormalAlloterPtr() {
    return std::make_shared<NormalAlloter>();
}